

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O0

int SUNLinSolSetup_Band(SUNLinearSolver S,SUNMatrix A)

{
  realtype **a;
  sunindextype *p;
  int iVar1;
  sunindextype sVar2;
  long local_40;
  sunindextype *pivots;
  realtype **A_cols;
  SUNMatrix A_local;
  SUNLinearSolver S_local;
  
  if ((A == (SUNMatrix)0x0) || (S == (SUNLinearSolver)0x0)) {
    S_local._4_4_ = -1;
  }
  else {
    iVar1 = SUNMatGetID(A);
    if (iVar1 == 1) {
      a = *(realtype ***)((long)A->content + 0x40);
      p = *(sunindextype **)((long)S->content + 8);
      if ((a == (realtype **)0x0) || (p == (sunindextype *)0x0)) {
        *(undefined8 *)((long)S->content + 0x10) = 0xfffffffffffffffd;
        S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x10);
      }
      else {
        if (*(long *)((long)A->content + 8) + -1 <
            *(long *)((long)A->content + 0x18) + *(long *)((long)A->content + 0x20)) {
          local_40 = *(long *)((long)A->content + 8) + -1;
        }
        else {
          local_40 = *(long *)((long)A->content + 0x18) + *(long *)((long)A->content + 0x20);
        }
        if (*(long *)((long)A->content + 0x28) < local_40) {
          *(undefined8 *)((long)S->content + 0x10) = 0xfffffffffffffffd;
          S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x10);
        }
        else {
          sVar2 = bandGBTRF(a,*(sunindextype *)((long)A->content + 8),
                            *(sunindextype *)((long)A->content + 0x18),
                            *(sunindextype *)((long)A->content + 0x20),
                            *(sunindextype *)((long)A->content + 0x28),p);
          *(sunindextype *)((long)S->content + 0x10) = sVar2;
          if (*(long *)((long)S->content + 0x10) < 1) {
            S_local._4_4_ = 0;
          }
          else {
            S_local._4_4_ = 8;
          }
        }
      }
    }
    else {
      *(undefined8 *)((long)S->content + 0x10) = 0xfffffffffffffffe;
      S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x10);
    }
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolSetup_Band(SUNLinearSolver S, SUNMatrix A)
{
  realtype **A_cols;
  sunindextype *pivots;

  /* check for valid inputs */
  if ( (A == NULL) || (S == NULL) ) 
    return(SUNLS_MEM_NULL);
  
  /* Ensure that A is a band matrix */
  if (SUNMatGetID(A) != SUNMATRIX_BAND) {
    LASTFLAG(S) = SUNLS_ILL_INPUT;
    return(LASTFLAG(S));
  }
  
  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  pivots = NULL;
  A_cols = SM_COLS_B(A);
  pivots = PIVOTS(S);
  if ( (A_cols == NULL) || (pivots == NULL) ) {
    LASTFLAG(S) = SUNLS_MEM_FAIL;
    return(LASTFLAG(S));
  }

  /* ensure that storage upper bandwidth is sufficient for fill-in */
  if (SM_SUBAND_B(A) < SUNMIN(SM_COLUMNS_B(A)-1, SM_UBAND_B(A) + SM_LBAND_B(A))) {
    LASTFLAG(S) = SUNLS_MEM_FAIL;
    return(LASTFLAG(S));
  }
  
  /* perform LU factorization of input matrix */
  LASTFLAG(S) = bandGBTRF(A_cols, SM_COLUMNS_B(A), SM_UBAND_B(A),
			  SM_LBAND_B(A), SM_SUBAND_B(A), pivots);
  
  /* store error flag (if nonzero, that row encountered zero-valued pivod) */
  if (LASTFLAG(S) > 0)
    return(SUNLS_LUFACT_FAIL);
  return(SUNLS_SUCCESS);
}